

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

void __thiscall
helics::InterfaceInfo::createInput
          (InterfaceInfo *this,InterfaceHandle handle,string_view key,string_view type,
          string_view units,uint16_t flags)

{
  InputInfo *this_00;
  DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle> *this_01;
  handle ciHandle;
  InterfaceHandle local_8c;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle> *local_58;
  unique_lock<std::shared_mutex> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  GlobalHandle local_30;
  
  local_40._M_str = type._M_str;
  local_40._M_len = type._M_len;
  local_88._M_str = key._M_str;
  local_88._M_len = key._M_len;
  local_58 = (DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle>
              *)&this->inputs;
  local_50._M_device = &(this->inputs).m_mutex;
  local_50._M_owns = false;
  local_8c.hid = handle.hid;
  std::unique_lock<std::shared_mutex>::lock(&local_50);
  this_01 = local_58;
  local_50._M_owns = true;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,local_88._M_str,local_88._M_str + local_88._M_len);
  local_30.fed_id.gid = (this->global_id)._M_i.gid;
  local_30.handle.hid = local_8c.hid;
  gmlc::containers::
  DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle>::
  insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            (this_01,&local_78,&local_8c,&local_30,&local_88,&local_40,&units);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  this_00 = *(InputInfo **)(*(long *)(local_58 + 8) + -8);
  this_00->only_update_on_change = this->only_update_on_change;
  if ((flags & 4) != 0) {
    InputInfo::setProperty(this_00,0x18d,1);
  }
  if ((flags >> 8 & 1) != 0) {
    InputInfo::setProperty(*(InputInfo **)(*(long *)(local_58 + 8) + -8),0x192,1);
  }
  if ((flags & 0x40) != 0) {
    InputInfo::setProperty(*(InputInfo **)(*(long *)(local_58 + 8) + -8),0x1c6,1);
  }
  if ((flags & 8) != 0) {
    InputInfo::setProperty(*(InputInfo **)(*(long *)(local_58 + 8) + -8),0x197,1);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_50);
  return;
}

Assistant:

void InterfaceInfo::createInput(InterfaceHandle handle,
                                std::string_view key,
                                std::string_view type,
                                std::string_view units,
                                std::uint16_t flags)
{
    auto ciHandle = inputs.lock();
    ciHandle->insert(std::string(key), handle, GlobalHandle{global_id, handle}, key, type, units);
    ciHandle->back()->only_update_on_change = only_update_on_change;

    if (checkActionFlag(flags, required_flag)) {
        ciHandle->back()->setProperty(defs::Options::CONNECTION_REQUIRED, 1);
    }
    if (checkActionFlag(flags, optional_flag)) {
        ciHandle->back()->setProperty(defs::Options::CONNECTION_OPTIONAL, 1);
    }
    if (checkActionFlag(flags, only_update_on_change_flag)) {
        ciHandle->back()->setProperty(defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE, 1);
    }
    if (checkActionFlag(flags, single_connection_flag)) {
        ciHandle->back()->setProperty(defs::Options::SINGLE_CONNECTION_ONLY, 1);
    }
}